

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O2

void __thiscall
c4::yml::
Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
::_emit_yaml(Emitter<c4::yml::WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *this,size_t id)

{
  NodeType_e NVar1;
  pfn_error p_Var2;
  code *pcVar3;
  Location LVar4;
  Location LVar5;
  Location LVar6;
  NodeType_e NVar7;
  bool bVar8;
  error_flags eVar9;
  NodeData *pNVar10;
  NodeType NVar11;
  size_t sVar12;
  size_t sVar13;
  NodeScalar *pNVar14;
  csubstr *pcVar15;
  ulong next_level;
  Tree *this_00;
  TagDirectiveProxy TVar16;
  csubstr cVar17;
  anon_class_8_1_8991fb9c dispatch;
  char msg [42];
  anon_class_24_3_fd5fe6d2 write_tag_directives;
  char *pcStack_90;
  size_t local_88;
  char *pcStack_68;
  size_t local_60;
  char *pcStack_40;
  size_t local_38;
  TagDirective *btd;
  
  dispatch.this = this;
  bVar8 = Tree::is_root(this->m_tree,id);
  if (((!bVar8) &&
      (pNVar10 = Tree::_p(this->m_tree,id), ((pNVar10->m_type).type & (STREAM|MAP)) != NOTYPE)) &&
     (NVar11 = Tree::type(this->m_tree,id),
     (NVar11.type & (_WIP_STYLE_FLOW_ML|_WIP_STYLE_FLOW_SL)) == NOTYPE)) {
    pNVar10 = Tree::_p(this->m_tree,id);
    bVar8 = ((pNVar10->m_type).type & KEY) != NOTYPE;
    if (bVar8) {
      pcVar15 = Tree::key(this->m_tree,id);
      WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_do_write(&this->
                   super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  ,*pcVar15);
      WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                ((WriterOStream<std::__cxx11::ostringstream> *)this,(char (*) [3])":\n");
    }
    next_level = (ulong)bVar8;
    _do_visit_block_container(this,id,next_level,next_level);
    return;
  }
  TVar16 = Tree::tag_directives(this->m_tree);
  btd = TVar16.b;
  TVar16 = Tree::tag_directives(this->m_tree);
  write_tag_directives.etd = TVar16.e;
  write_tag_directives.btd = &btd;
  write_tag_directives.this = this;
  pNVar10 = Tree::_p(this->m_tree,id);
  if ((~(int)(pNVar10->m_type).type & 0x28U) == 0) {
    sVar12 = Tree::first_child(this->m_tree,id);
    if (sVar12 != 0xffffffffffffffff) {
      sVar12 = Tree::first_child(this->m_tree,id);
      _emit_yaml::anon_class_24_3_fd5fe6d2::operator()(&write_tag_directives,sVar12);
    }
    sVar12 = Tree::first_child(this->m_tree,id);
    for (; sVar12 != 0xffffffffffffffff; sVar12 = Tree::next_sibling(this->m_tree,sVar12)) {
      _emit_yaml::anon_class_8_1_8991fb9c::operator()(&dispatch,sVar12);
      sVar13 = Tree::next_sibling(this->m_tree,sVar12);
      if (sVar13 != 0xffffffffffffffff) {
        sVar13 = Tree::next_sibling(this->m_tree,sVar12);
        _emit_yaml::anon_class_24_3_fd5fe6d2::operator()(&write_tag_directives,sVar13);
      }
    }
  }
  else {
    pNVar10 = Tree::_p(this->m_tree,id);
    if (((pNVar10->m_type).type & (STREAM|MAP)) == NOTYPE) {
      pNVar10 = Tree::_p(this->m_tree,id);
      NVar7 = (pNVar10->m_type).type;
      pNVar10 = Tree::_p(this->m_tree,id);
      NVar1 = (pNVar10->m_type).type;
      if ((NVar7 & DOC) == NOTYPE) {
        if ((~(uint)NVar1 & 3) == 0) {
          pNVar14 = Tree::keysc(this->m_tree,id);
          pNVar10 = Tree::_p(this->m_tree,id);
          _write(this,(int)pNVar14,(void *)(ulong)((uint)(pNVar10->m_type).type & 0x2aa2142),0);
          WriterOStream<std::__cxx11::ostringstream>::_do_write<3ul>
                    ((WriterOStream<std::__cxx11::ostringstream> *)this,(char (*) [3])0x20b38f);
          this_00 = this->m_tree;
        }
        else {
          pNVar10 = Tree::_p(this->m_tree,id);
          this_00 = this->m_tree;
          if (((pNVar10->m_type).type & KEYVAL) != VAL) {
            NVar11 = Tree::type(this_00,id);
            if (NVar11.type == NOTYPE) {
              return;
            }
            builtin_strncpy(msg + 8,"type",5);
            builtin_strncpy(msg,"unknown ",8);
            eVar9 = get_error_flags();
            if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
              pcVar3 = (code *)swi(3);
              (*pcVar3)();
              return;
            }
            p_Var2 = (this->m_tree->m_callbacks).m_error;
            cVar17 = to_csubstr(
                               "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                               );
            local_88 = cVar17.len;
            pcStack_90 = cVar17.str;
            LVar6.super_LineCol.col = 0;
            LVar6.super_LineCol.offset = SUB168(ZEXT816(0x589c) << 0x40,0);
            LVar6.super_LineCol.line = SUB168(ZEXT816(0x589c) << 0x40,8);
            LVar6.name.str = pcStack_90;
            LVar6.name.len = local_88;
            (*p_Var2)(msg,0xd,LVar6,(this->m_tree->m_callbacks).m_user_data);
            return;
          }
        }
        pNVar14 = Tree::valsc(this_00,id);
        pNVar10 = Tree::_p(this->m_tree,id);
        _write(this,(int)pNVar14,(void *)(ulong)((uint)(pNVar10->m_type).type & 0x5541281),0);
        NVar11 = Tree::type(this->m_tree,id);
        if ((NVar11.type & (_WIP_STYLE_FLOW_ML|_WIP_STYLE_FLOW_SL)) == NOTYPE) {
          WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::_do_write(&this->
                       super_WriterOStream<std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      ,'\n');
        }
      }
      else {
        if ((NVar1 & (STREAM|MAP)) != NOTYPE) {
          builtin_strncpy(msg + 0x10,"m_tree->is_container(id))",0x1a);
          builtin_strncpy(msg,"check failed: (!",0x10);
          eVar9 = get_error_flags();
          if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          p_Var2 = (this->m_tree->m_callbacks).m_error;
          cVar17 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_38 = cVar17.len;
          pcStack_40 = cVar17.str;
          LVar4.super_LineCol.col = 0;
          LVar4.super_LineCol.offset = SUB168(ZEXT816(0x5883) << 0x40,0);
          LVar4.super_LineCol.line = SUB168(ZEXT816(0x5883) << 0x40,8);
          LVar4.name.str = pcStack_40;
          LVar4.name.len = local_38;
          (*p_Var2)(msg,0x2a,LVar4,(this->m_tree->m_callbacks).m_user_data);
        }
        pNVar10 = Tree::_p(this->m_tree,id);
        if (((pNVar10->m_type).type & KEYVAL) != VAL) {
          builtin_strncpy(msg,"check failed: (m_tree->is_val(id))",0x23);
          eVar9 = get_error_flags();
          if (((eVar9 & 1) != 0) && (bVar8 = is_debugger_attached(), bVar8)) {
            pcVar3 = (code *)swi(3);
            (*pcVar3)();
            return;
          }
          p_Var2 = (this->m_tree->m_callbacks).m_error;
          cVar17 = to_csubstr(
                             "/workspace/llm4binary/github/license_c_cmakelists/google[P]jsonnet/third_party/rapidyaml/ryml_all.hpp"
                             );
          local_60 = cVar17.len;
          pcStack_68 = cVar17.str;
          LVar5.super_LineCol.col = 0;
          LVar5.super_LineCol.offset = SUB168(ZEXT816(0x5884) << 0x40,0);
          LVar5.super_LineCol.line = SUB168(ZEXT816(0x5884) << 0x40,8);
          LVar5.name.str = pcStack_68;
          LVar5.name.len = local_60;
          (*p_Var2)(msg,0x23,LVar5,(this->m_tree->m_callbacks).m_user_data);
        }
        _write_doc(this,id);
      }
    }
    else {
      _emit_yaml::anon_class_8_1_8991fb9c::operator()(&dispatch,id);
    }
  }
  return;
}

Assistant:

void Emitter<Writer>::_emit_yaml(size_t id)
{
    // save branches in the visitor by doing the initial stream/doc
    // logic here, sparing the need to check stream/val/keyval inside
    // the visitor functions
    auto dispatch = [this](size_t node){
        NodeType ty = m_tree->type(node);
        if(ty.marked_flow_sl())
            _do_visit_flow_sl(node, 0);
        else if(ty.marked_flow_ml())
            _do_visit_flow_ml(node, 0);
        else
        {
            _do_visit_block(node, 0);
        }
    };
    if(!m_tree->is_root(id))
    {
        if(m_tree->is_container(id) && !m_tree->type(id).marked_flow())
        {
            size_t ilevel = 0;
            if(m_tree->has_key(id))
            {
                this->Writer::_do_write(m_tree->key(id));
                this->Writer::_do_write(":\n");
                ++ilevel;
            }
            _do_visit_block_container(id, ilevel, ilevel);
            return;
        }
    }

    auto *btd = m_tree->tag_directives().b;
    auto *etd = m_tree->tag_directives().e;
    auto write_tag_directives = [&btd, etd, this](size_t next_node){
        auto end = btd;
        while(end < etd)
        {
            if(end->next_node_id > next_node)
                break;
            ++end;
        }
        for( ; btd != end; ++btd)
        {
            if(next_node != m_tree->first_child(m_tree->parent(next_node)))
                this->Writer::_do_write("...\n");
            this->Writer::_do_write("%TAG ");
            this->Writer::_do_write(btd->handle);
            this->Writer::_do_write(' ');
            this->Writer::_do_write(btd->prefix);
            this->Writer::_do_write('\n');
        }
    };
    if(m_tree->is_stream(id))
    {
        if(m_tree->first_child(id) != NONE)
            write_tag_directives(m_tree->first_child(id));
        for(size_t child = m_tree->first_child(id); child != NONE; child = m_tree->next_sibling(child))
        {
            dispatch(child);
            if(m_tree->next_sibling(child) != NONE)
                write_tag_directives(m_tree->next_sibling(child));
        }
    }
    else if(m_tree->is_container(id))
    {
        dispatch(id);
    }
    else if(m_tree->is_doc(id))
    {
        _RYML_CB_ASSERT(m_tree->callbacks(), !m_tree->is_container(id)); // checked above
        _RYML_CB_ASSERT(m_tree->callbacks(), m_tree->is_val(id)); // so it must be a val
        _write_doc(id);
    }
    else if(m_tree->is_keyval(id))
    {
        _writek(id, 0);
        this->Writer::_do_write(": ");
        _writev(id, 0);
        if(!m_tree->type(id).marked_flow())
            this->Writer::_do_write('\n');
    }
    else if(m_tree->is_val(id))
    {
        //this->Writer::_do_write("- ");
        _writev(id, 0);
        if(!m_tree->type(id).marked_flow())
            this->Writer::_do_write('\n');
    }
    else if(m_tree->type(id) == NOTYPE)
    {
        ;
    }
    else
    {
        _RYML_CB_ERR(m_tree->callbacks(), "unknown type");
    }
}